

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O2

void __thiscall string_to_bool_Test::~string_to_bool_Test(string_to_bool_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(string, to_bool)
{
    EXPECT_TRUE(ST_LITERAL("true").to_bool());
    EXPECT_TRUE(ST_LITERAL("TRUE").to_bool());
    EXPECT_FALSE(ST_LITERAL("false").to_bool());
    EXPECT_FALSE(ST_LITERAL("FALSE").to_bool());

    EXPECT_FALSE(ST_LITERAL("0").to_bool());
    EXPECT_TRUE(ST_LITERAL("1").to_bool());
    EXPECT_TRUE(ST_LITERAL("-1").to_bool());
    EXPECT_TRUE(ST_LITERAL("1000").to_bool());
    EXPECT_TRUE(ST_LITERAL("0x1000").to_bool());

    EXPECT_FALSE(ST_LITERAL("T").to_bool());
    EXPECT_FALSE(ST_LITERAL("trueXX").to_bool());

    EXPECT_FALSE(ST::string().to_bool());
}